

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leg_track.cpp
# Opt level: O0

void __thiscall
cp::LegTrack::setStepVar
          (LegTrack *this,Pose *ref_landpose_leg_w,Quat *ref_waist,rl swingleg,walking_state wstate)

{
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *pDVar1;
  Scalar *pSVar2;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_78;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_48;
  walking_state local_28;
  rl local_24;
  walking_state wstate_local;
  rl swingleg_local;
  Quat *ref_waist_local;
  Pose *ref_landpose_leg_w_local;
  LegTrack *this_local;
  
  *(undefined8 *)(this + 0x1e0) = *(undefined8 *)(this + 0x1b8);
  *(undefined8 *)(this + 0x1e8) = *(undefined8 *)(this + 0x1c0);
  *(undefined8 *)(this + 0x1f0) = *(undefined8 *)(this + 0x1b0);
  *(double *)(this + 0x1f8) = *(double *)(this + 0x1e0) + *(double *)(this + 0x1e8);
  *(rl *)(this + 0x440) = swingleg;
  *(walking_state *)(this + 0x444) = wstate;
  local_28 = wstate;
  local_24 = swingleg;
  _wstate_local = ref_waist;
  ref_waist_local = (Quat *)ref_landpose_leg_w;
  ref_landpose_leg_w_local = (Pose *)this;
  Pose::set((Pose *)(this + 0x610),(Pose *)(this + 0x260));
  Pose::set((Pose *)(this + 0x6f0),(Pose *)(this + 0x340));
  Pose::set((Pose *)(this + 0x260),(Pose *)ref_waist_local);
  Pose::set((Pose *)(this + 0x340),(Pose *)(ref_waist_local + 7));
  Eigen::Quaternion<double,_0>::operator=
            ((Quaternion<double,_0> *)(this + 0x240),(Quaternion<double,_0> *)(this + 0x220));
  Eigen::Quaternion<double,_0>::operator=((Quaternion<double,_0> *)(this + 0x220),_wstate_local);
  pDVar1 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
           Pose::p((Pose *)(this + (ulong)*(uint *)(this + 0x440) * 0xe0 + 0x610));
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::x(pDVar1);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator<<
            (&local_48,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)(this + 0x420),pSVar2);
  pDVar1 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
           Pose::p((Pose *)(this + (ulong)*(uint *)(this + 0x440) * 0xe0 + 0x610));
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y(pDVar1);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_48,pSVar2);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_48);
  pDVar1 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
           Pose::p((Pose *)(this + (ulong)*(uint *)(this + 0x440) * 0xe0 + 0x260));
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::x(pDVar1);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator<<
            (&local_78,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)(this + 0x430),pSVar2);
  pDVar1 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
           Pose::p((Pose *)(this + (ulong)*(uint *)(this + 0x440) * 0xe0 + 0x260));
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y(pDVar1);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_78,pSVar2);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_78);
  interpolation<double>::setInter5
            ((interpolation<double> *)this,*(double *)(this + 0x1d8),0.0,0.0,
             *(double *)(this + 0x1d0),0.0,0.0,*(double *)(this + 0x1b8) * 0.5);
  interpolation<double>::setInter5
            ((interpolation<double> *)(this + 0x30),*(double *)(this + 0x1d0),0.0,0.0,
             *(double *)(this + 0x1d8),0.0,0.0,*(double *)(this + 0x1b8) * 0.5);
  return;
}

Assistant:

void LegTrack::setStepVar(const Pose ref_landpose_leg_w[],
     const Quat &ref_waist, rl swingleg, walking_state wstate) {
  // set time var of a step
  sst_s = sst;
  dst_s = dst;
  dt_s  = dt;
  st_s = sst_s + dst_s;
  swl = swingleg;
  ws = wstate;
  // set next landing pos
  bfr_landpose[right].set(ref_landpose[right]);
  bfr_landpose[left].set(ref_landpose[left]);
  ref_landpose[right].set(ref_landpose_leg_w[right]);
  ref_landpose[left].set(ref_landpose_leg_w[left]);
  bfr_waist_r = ref_waist_r;
  ref_waist_r = ref_waist;

  // for (x, y) lerp
  bfr << bfr_landpose[swl].p().x(), bfr_landpose[swl].p().y();
  ref << ref_landpose[swl].p().x(), ref_landpose[swl].p().y();
  // for z lerp
  inter_z_1.setInter5(ground_h, 0.0, 0.0, leg_h, 0.0, 0.0, sst*0.5);
  inter_z_2.setInter5(leg_h, 0.0, 0.0, ground_h, 0.0, 0.0, sst*0.5);
}